

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

int stb_vorbis_decode_filename(char *filename,int *channels,int *sample_rate,short **output)

{
  int iVar1;
  stb_vorbis *f;
  short *psVar2;
  short *__ptr;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int error;
  
  f = stb_vorbis_open_filename(filename,&error,(stb_vorbis_alloc *)0x0);
  if (f == (stb_vorbis *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = f->channels;
    *channels = iVar3;
    uVar4 = (long)iVar3 << 0xc;
    if (sample_rate != (int *)0x0) {
      *sample_rate = f->sample_rate;
    }
    psVar2 = (short *)malloc((long)iVar3 * 0x2000);
    iVar3 = -2;
    if (psVar2 != (short *)0x0) {
      iVar5 = 0;
      uVar7 = uVar4 & 0xffffffff;
      iVar3 = 0;
      do {
        do {
          __ptr = psVar2;
          iVar6 = (int)uVar7;
          iVar1 = stb_vorbis_get_frame_short_interleaved(f,f->channels,__ptr + iVar5,iVar6 - iVar5);
          if (iVar1 == 0) {
            *output = __ptr;
            goto LAB_0015ea1f;
          }
          iVar3 = iVar3 + iVar1;
          iVar5 = iVar5 + f->channels * iVar1;
          psVar2 = __ptr;
        } while ((int)uVar4 + iVar5 <= iVar6);
        uVar7 = (ulong)(uint)(iVar6 * 2);
        psVar2 = (short *)realloc(__ptr,(long)(iVar6 * 2) * 2);
      } while (psVar2 != (short *)0x0);
      free(__ptr);
      iVar3 = -2;
    }
LAB_0015ea1f:
    stb_vorbis_close(f);
  }
  return iVar3;
}

Assistant:

int stb_vorbis_decode_filename(const char *filename, int *channels, int *sample_rate, short **output)
{
   int data_len, offset, total, limit, error;
   short *data;
   stb_vorbis *v = stb_vorbis_open_filename(filename, &error, NULL);
   if (v == NULL) return -1;
   limit = v->channels * 4096;
   *channels = v->channels;
   if (sample_rate)
      *sample_rate = v->sample_rate;
   offset = data_len = 0;
   total = limit;
   data = (short *) malloc(total * sizeof(*data));
   if (data == NULL) {
      stb_vorbis_close(v);
      return -2;
   }
   for (;;) {
      int n = stb_vorbis_get_frame_short_interleaved(v, v->channels, data+offset, total-offset);
      if (n == 0) break;
      data_len += n;
      offset += n * v->channels;
      if (offset + limit > total) {
         short *data2;
         total *= 2;
         data2 = (short *) realloc(data, total * sizeof(*data));
         if (data2 == NULL) {
            free(data);
            stb_vorbis_close(v);
            return -2;
         }
         data = data2;
      }
   }
   *output = data;
   stb_vorbis_close(v);
   return data_len;
}